

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O0

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec2i *pts,TGAColor *colors)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  TGAImage *this_00;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *__b;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 *paVar10;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 *paVar11;
  float *pfVar12;
  Vec3f VVar13;
  TGAColor local_95;
  undefined1 auStack_90 [3];
  TGAColor c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_88;
  vec<2,_float,_(glm::qualifier)0> local_7c;
  vec<2,_float,_(glm::qualifier)0> local_74;
  vec<2,_float,_(glm::qualifier)0> local_6c;
  vec<2,_float,_(glm::qualifier)0> local_64;
  undefined1 local_5c [8];
  Vec3f bc_screen;
  Vec2i p;
  int width;
  int local_3c;
  int j;
  int i;
  Vec2i clamp;
  Vec2i bboxmax;
  Vec2i bboxmin;
  TGAColor *colors_local;
  Vec2i *pts_local;
  TinyRender *this_local;
  
  iVar6 = TGAImage::get_width(this->mImage);
  iVar7 = TGAImage::get_height(this->mImage);
  glm::vec<2,_int,_(glm::qualifier)0>::vec(&bboxmax,iVar6 + -1,iVar7 + -1);
  memset(&clamp,0,8);
  iVar6 = TGAImage::get_width(this->mImage);
  iVar7 = TGAImage::get_height(this->mImage);
  glm::vec<2,_int,_(glm::qualifier)0>::vec
            ((vec<2,_int,_(glm::qualifier)0> *)&j,iVar6 + -1,iVar7 + -1);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    for (width = 0; width < 2; width = width + 1) {
      p.field_1.y = 0;
      piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,width);
      piVar9 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](pts + local_3c,width);
      piVar8 = std::min<int>(piVar8,piVar9);
      piVar8 = std::max<int>(&p.field_1.y,piVar8);
      iVar6 = *piVar8;
      piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,width);
      *piVar8 = iVar6;
      piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&j,width);
      piVar9 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,width);
      __b = glm::vec<2,_int,_(glm::qualifier)0>::operator[](pts + local_3c,width);
      piVar9 = std::max<int>(piVar9,__b);
      piVar8 = std::min<int>(piVar8,piVar9);
      iVar6 = *piVar8;
      piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,width);
      *piVar8 = iVar6;
    }
  }
  p.field_0.x = TGAImage::get_width(this->mImage);
  paVar10 = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 *)
            glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                      ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
  *paVar10 = bboxmax.field_0;
  while (piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                            ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0),
        aVar5 = bboxmax.field_1, *piVar8 <= clamp.field_0.x) {
    paVar11 = (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 *)
              glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                        ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
    *paVar11 = aVar5;
    while (piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                              ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1),
          *piVar8 <= clamp.field_1.y) {
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_64,pts);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_6c,pts + 1);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_74,pts + 2);
      glm::vec<2,float,(glm::qualifier)0>::vec<int,(glm::qualifier)0>
                ((vec<2,float,(glm::qualifier)0> *)&local_7c,
                 (vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1);
      VVar13 = barycentric<2ul>(local_64,local_6c,local_74,local_7c);
      _auStack_90 = VVar13._0_8_;
      local_5c._0_4_ = _auStack_90;
      local_5c[4] = c.bgra[1];
      local_5c[5] = c.bgra[2];
      local_5c[6] = c.bgra[3];
      local_5c[7] = c.bytespp;
      local_88 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar13.field_2;
      bc_screen.field_0 = local_88;
      _auStack_90 = VVar13;
      pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)local_5c,0);
      if (((0.0 < *pfVar12 || *pfVar12 == 0.0) &&
          (pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)local_5c,1),
          0.0 < *pfVar12 || *pfVar12 == 0.0)) &&
         (pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_5c,2),
         0.0 < *pfVar12 || *pfVar12 == 0.0)) {
        TGAColor::TGAColor(&local_95);
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,0);
        fVar1 = *pfVar12;
        bVar3 = colors->bgra[0];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,1);
        fVar2 = *pfVar12;
        bVar4 = colors[1].bgra[0];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,2);
        local_95.bgra[0] =
             (uchar)(int)(*pfVar12 * (float)colors[2].bgra[0] +
                         fVar1 * (float)bVar3 + fVar2 * (float)bVar4);
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,0);
        fVar1 = *pfVar12;
        bVar3 = colors->bgra[1];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,1);
        fVar2 = *pfVar12;
        bVar4 = colors[1].bgra[1];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,2);
        local_95.bgra[1] =
             (uchar)(int)(*pfVar12 * (float)colors[2].bgra[1] +
                         fVar1 * (float)bVar3 + fVar2 * (float)bVar4);
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,0);
        fVar1 = *pfVar12;
        bVar3 = colors->bgra[2];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,1);
        fVar2 = *pfVar12;
        bVar4 = colors[1].bgra[2];
        pfVar12 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_5c,2);
        local_95.bgra[2] =
             (uchar)(int)(*pfVar12 * (float)colors[2].bgra[2] +
                         fVar1 * (float)bVar3 + fVar2 * (float)bVar4);
        this_00 = this->mImage;
        piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                           ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
        iVar6 = *piVar8;
        piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                           ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
        TGAImage::set(this_00,iVar6,*piVar8,&local_95);
      }
      piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                         ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      *piVar8 = *piVar8 + 1;
    }
    piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    *piVar8 = *piVar8 + 1;
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec2i* pts, TGAColor* colors) {
  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  int width = mImage->get_width();

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;
      TGAColor c;
      /*
              barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];
      mImage->set(p[0], p[1], c);
    }
  }
}